

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O3

int Gem_GroupsDerive(word *pTruth,int nVars,word *pCof0,word *pCof1)

{
  word wVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  word *pwVar7;
  word *pwVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  word *pwVar13;
  ulong uVar14;
  word *pLimit;
  uint local_54;
  word *pLimit_2;
  
  local_54 = 1 << ((byte)(nVars - 1U) & 0x1f);
  if (1 < nVars) {
    uVar2 = 1 << ((char)nVars - 6U & 0x1f);
    if ((uint)nVars < 7) {
      uVar2 = 1;
    }
    uVar14 = (ulong)uVar2;
    uVar9 = 0;
    do {
      uVar10 = uVar9 + 1;
      bVar4 = (byte)uVar9;
      if (uVar2 == 1) {
        bVar3 = (byte)(1 << (bVar4 & 0x1f));
        *pCof0 = (s_Truths6Neg[uVar9] & *pTruth) << (bVar3 & 0x3f) | s_Truths6Neg[uVar9] & *pTruth;
        *pCof1 = (s_Truths6[uVar9] & *pTruth) >> (bVar3 & 0x3f) | s_Truths6[uVar9] & *pTruth;
        bVar4 = (byte)(2 << (bVar4 & 0x1f));
        *pCof0 = (s_Truths6[uVar10] & *pCof0) >> (bVar4 & 0x3f) | s_Truths6[uVar10] & *pCof0;
        *pCof1 = (s_Truths6Neg[uVar10] & *pCof1) << (bVar4 & 0x3f) | s_Truths6Neg[uVar10] & *pCof1;
LAB_004877e9:
        uVar5 = 0;
        do {
          if (pCof0[uVar5] != pCof1[uVar5]) {
            local_54 = local_54 | 1 << ((uint)uVar9 & 0x1f);
            break;
          }
          uVar5 = uVar5 + 1;
        } while (uVar14 != uVar5);
      }
      else if (uVar9 < 6) {
        if (0 < (int)uVar2) {
          uVar5 = s_Truths6Neg[uVar9];
          uVar12 = 0;
          do {
            pCof0[uVar12] =
                 (pTruth[uVar12] & uVar5) << ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) |
                 pTruth[uVar12] & uVar5;
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
LAB_004878d8:
          if (uVar9 < 6) {
            if (0 < (int)uVar2) {
              uVar5 = s_Truths6[uVar9];
              uVar12 = 0;
              do {
                pCof1[uVar12] =
                     (pTruth[uVar12] & uVar5) >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) |
                     pTruth[uVar12] & uVar5;
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
            }
          }
          else {
            if ((int)uVar2 < 1) goto LAB_00487b31;
            bVar3 = (byte)(uVar9 - 6);
            uVar6 = 1 << (bVar3 & 0x1f);
            iVar11 = 2 << (bVar3 & 0x1f);
            uVar5 = 1;
            pwVar8 = pTruth;
            pwVar7 = pCof1;
            if (1 < (int)uVar6) {
              uVar5 = (ulong)uVar6;
            }
            do {
              if (uVar9 - 6 != 0x1f) {
                uVar12 = 0;
                do {
                  wVar1 = pwVar8[(long)(int)uVar6 + uVar12];
                  pwVar7[uVar12] = wVar1;
                  pwVar7[(long)(int)uVar6 + uVar12] = wVar1;
                  uVar12 = uVar12 + 1;
                } while (uVar5 != uVar12);
              }
              pwVar8 = pwVar8 + iVar11;
              pwVar7 = pwVar7 + iVar11;
            } while (pwVar8 < pTruth + (int)uVar2);
          }
        }
        if (uVar9 < 5) {
          if (0 < (int)uVar2) {
            uVar5 = s_Truths6[uVar10];
            uVar12 = 0;
            do {
              pCof0[uVar12] =
                   (pCof0[uVar12] & uVar5) >> ((byte)(2 << (bVar4 & 0x1f)) & 0x3f) |
                   pCof0[uVar12] & uVar5;
              uVar12 = uVar12 + 1;
            } while (uVar14 != uVar12);
            if (4 < uVar9) goto LAB_00487aac;
            if (0 < (int)uVar2) {
              uVar5 = s_Truths6Neg[uVar10];
              uVar12 = 0;
              do {
                pCof1[uVar12] =
                     (pCof1[uVar12] & uVar5) << ((byte)(2 << (bVar4 & 0x1f)) & 0x3f) |
                     pCof1[uVar12] & uVar5;
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
              goto LAB_00487b10;
            }
          }
        }
        else if (0 < (int)uVar2) {
          bVar4 = (byte)(uVar9 - 5);
          uVar6 = 1 << (bVar4 & 0x1f);
          uVar5 = 1;
          if (1 < (int)uVar6) {
            uVar5 = (ulong)uVar6;
          }
          pwVar8 = pCof0;
          do {
            if (uVar9 - 5 != 0x1f) {
              uVar12 = 0;
              do {
                pwVar8[uVar12] = pwVar8[(long)(int)uVar6 + uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar5 != uVar12);
            }
            pwVar8 = pwVar8 + (2 << (bVar4 & 0x1f));
          } while (pwVar8 < pCof0 + (int)uVar2);
LAB_00487aac:
          if (0 < (int)uVar2) {
            bVar4 = (byte)(uVar9 - 5);
            uVar6 = 1 << (bVar4 & 0x1f);
            iVar11 = 2 << (bVar4 & 0x1f);
            uVar5 = 1;
            if (1 < (int)uVar6) {
              uVar5 = (ulong)uVar6;
            }
            pwVar8 = pCof1 + (int)uVar6;
            pwVar7 = pCof1;
            do {
              if (uVar9 - 5 != 0x1f) {
                uVar12 = 0;
                do {
                  pwVar8[uVar12] = pwVar7[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar5 != uVar12);
              }
              pwVar7 = pwVar7 + iVar11;
              pwVar8 = pwVar8 + iVar11;
            } while (pwVar7 < pCof1 + (int)uVar2);
LAB_00487b10:
            if (0 < (int)uVar2) goto LAB_004877e9;
          }
        }
      }
      else if (0 < (int)uVar2) {
        bVar3 = (byte)(uVar9 - 6);
        uVar6 = 1 << (bVar3 & 0x1f);
        iVar11 = 2 << (bVar3 & 0x1f);
        uVar5 = 1;
        if (1 < (int)uVar6) {
          uVar5 = (ulong)uVar6;
        }
        pwVar8 = pCof0 + (int)uVar6;
        pwVar7 = pCof0;
        pwVar13 = pTruth;
        do {
          if (uVar9 - 6 != 0x1f) {
            uVar12 = 0;
            do {
              wVar1 = pwVar13[uVar12];
              pwVar7[uVar12] = wVar1;
              pwVar8[uVar12] = wVar1;
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
          }
          pwVar13 = pwVar13 + iVar11;
          pwVar8 = pwVar8 + iVar11;
          pwVar7 = pwVar7 + iVar11;
        } while (pwVar13 < pTruth + (int)uVar2);
        goto LAB_004878d8;
      }
LAB_00487b31:
      uVar9 = uVar10;
    } while (uVar10 != nVars - 1U);
  }
  return local_54;
}

Assistant:

int Gem_GroupsDerive( word * pTruth, int nVars, word * pCof0, word * pCof1 )
{
    int v, Res = 1 << (nVars-1);
    for ( v = 0; v < nVars-1; v++ )
        if ( !Abc_TtVarsAreSymmetric(pTruth, nVars, v, v+1, pCof0, pCof1) )
            Res |= (1 << v);
    return Res;
}